

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x25519.h
# Opt level: O3

void hydro_x25519_sc_montmul(hydro_x25519_limb_t *out,hydro_x25519_limb_t *a,hydro_x25519_limb_t *b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  
  lVar15 = 0;
  uVar10 = 0;
  do {
    uVar14 = a[lVar15];
    uVar11 = 0xd2b51da312547e1b;
    lVar17 = 0;
    uVar16 = 0;
    uVar13 = 0;
    do {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar14;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = *(ulong *)((long)b + lVar17);
      auVar7[8] = CARRY8(uVar13,*(ulong *)((long)out + lVar17));
      auVar7._0_8_ = uVar13 + *(ulong *)((long)out + lVar17);
      auVar7._9_7_ = 0;
      auVar7 = auVar1 * auVar4 + auVar7;
      uVar18 = auVar7._0_8_;
      uVar13 = auVar7._8_8_;
      uVar12 = 1;
      if (lVar17 == 0) {
        uVar12 = uVar18;
      }
      uVar11 = uVar12 * uVar11;
      auVar8[8] = CARRY8(uVar18,uVar16);
      auVar8._0_8_ = uVar18 + uVar16;
      auVar8._9_7_ = 0;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar11;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = *(ulong *)((long)hydro_x25519_sc_p + lVar17);
      auVar8 = auVar2 * auVar5 + auVar8;
      uVar16 = auVar8._8_8_;
      if (lVar17 != 0) {
        *(long *)((long)out + lVar17 + -8) = auVar8._0_8_;
      }
      lVar17 = lVar17 + 8;
    } while (lVar17 != 0x20);
    uVar14 = uVar13 + uVar10;
    uVar10 = (ulong)CARRY8(uVar13,uVar10) + (ulong)CARRY8(uVar14,uVar16);
    lVar15 = lVar15 + 1;
    out[3] = uVar14 + uVar16;
  } while (lVar15 != 4);
  lVar15 = 0;
  uVar14 = 0;
  lVar17 = 0;
  do {
    uVar11 = *(ulong *)((long)out + lVar15);
    uVar16 = uVar14 + *(ulong *)((long)out + lVar15);
    uVar13 = *(ulong *)((long)hydro_x25519_sc_p + lVar15);
    *(ulong *)((long)out + lVar15) = uVar16 - *(ulong *)((long)hydro_x25519_sc_p + lVar15);
    uVar14 = (lVar17 + (ulong)CARRY8(uVar14,uVar11)) - (ulong)(uVar16 < uVar13);
    lVar15 = lVar15 + 8;
    lVar17 = (long)uVar14 >> 0x3f;
  } while (lVar15 != 0x20);
  lVar15 = 0;
  uVar11 = 0;
  do {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = -(uVar10 + uVar14);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *(ulong *)((long)hydro_x25519_sc_p + lVar15);
    auVar9[8] = CARRY8(uVar11,*(ulong *)((long)out + lVar15));
    auVar9._0_8_ = uVar11 + *(ulong *)((long)out + lVar15);
    auVar9._9_7_ = 0;
    auVar9 = auVar3 * auVar6 + auVar9;
    uVar11 = auVar9._8_8_;
    *(long *)((long)out + lVar15) = auVar9._0_8_;
    lVar15 = lVar15 + 8;
  } while (lVar15 != 0x20);
  return;
}

Assistant:

static void
hydro_x25519_sc_montmul(hydro_x25519_scalar_t out, const hydro_x25519_scalar_t a,
                        const hydro_x25519_scalar_t b)
{
    hydro_x25519_limb_t hic = 0;
    int                 i, j;

    for (i = 0; i < hydro_x25519_NLIMBS; i++) {
        hydro_x25519_limb_t carry = 0, carry2 = 0, mand = a[i],
                            mand2 = hydro_x25519_MONTGOMERY_FACTOR;

        for (j = 0; j < hydro_x25519_NLIMBS; j++) {
            hydro_x25519_limb_t acc = out[j];

            acc = hydro_x25519_umaal(&carry, acc, mand, b[j]);
            if (j == 0) {
                mand2 *= acc;
            }
            acc = hydro_x25519_umaal(&carry2, acc, mand2, hydro_x25519_sc_p[j]);
            if (j > 0) {
                out[j - 1] = acc;
            }
        }

        /* Add two carry registers and high carry */
        out[hydro_x25519_NLIMBS - 1] = hydro_x25519_adc(&hic, carry, carry2);
    }

    /* Reduce */
    hydro_x25519_sdlimb_t scarry = 0;
    for (i = 0; i < hydro_x25519_NLIMBS; i++) {
        out[i] = (hydro_x25519_limb_t) (scarry = scarry + out[i] - hydro_x25519_sc_p[i]);
        scarry >>= hydro_x25519_WBITS;
    }
    hydro_x25519_limb_t need_add = (hydro_x25519_limb_t) - (scarry + hic);

    hydro_x25519_limb_t carry = 0;
    for (i = 0; i < hydro_x25519_NLIMBS; i++) {
        out[i] = hydro_x25519_umaal(&carry, out[i], need_add, hydro_x25519_sc_p[i]);
    }
}